

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O1

void __thiscall
Refal2::COperationsBuilder::addStackDecrementOperation(COperationsBuilder *this,TStackIndex size)

{
  TStackIndex *pTVar1;
  COperation local_20;
  
  pTVar1 = &this->stackDepth;
  *pTVar1 = *pTVar1 - size;
  if (-1 < *pTVar1) {
    local_20.type = OT_DecrementStackDepth;
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_20);
    (((this->operations).last)->super_COperation).field_1.stackDecrement = size;
    return;
  }
  __assert_fail("stackDepth >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/OperationsBuilder.cpp"
                ,0x243,"void Refal2::COperationsBuilder::decreaseStackDepth(TStackIndex)");
}

Assistant:

void COperationsBuilder::decreaseStackDepth( TStackIndex size )
{
	stackDepth -= size;
	assert( stackDepth >= 0 );
}